

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)28,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  StrWriter *pSVar5;
  char **ppcVar6;
  undefined6 in_register_0000000a;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  
  uVar9 = *addr + 2;
  *addr = uVar9;
  iVar3 = (*this->_vptr_Moira[6])(this,(ulong)uVar9,addr,CONCAT62(in_register_0000000a,op));
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    cVar8 = 'b';
    lVar4 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "dbra"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pSVar5 = StrWriter::operator<<(str);
    if ((pSVar5->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar2 = (str->tab).raw;
      pcVar7 = pSVar5->ptr;
      do {
        pSVar5->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
        pcVar7 = pSVar5->ptr;
      } while (pcVar7 < pSVar5->base + iVar2);
      goto LAB_0028d39f;
    }
    ppcVar6 = &pSVar5->ptr;
    str = pSVar5;
  }
  else {
    pSVar5 = str;
    if (SVar1 == MUSASHI) {
      cVar8 = 'b';
      lVar4 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "dbra"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar2);
        goto LAB_0028d39f;
      }
    }
    else {
      cVar8 = 'b';
      lVar4 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = "dbra"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar2);
        goto LAB_0028d39f;
      }
    }
    ppcVar6 = &str->ptr;
  }
  pcVar7 = *ppcVar6;
  *ppcVar6 = pcVar7 + 1;
  *pcVar7 = ' ';
  pSVar5 = str;
LAB_0028d39f:
  StrWriter::operator<<(pSVar5,(UInt)(uVar9 + (int)(short)iVar3));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}